

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

field_t * SEM_VarDec(ast *node,attr *a,int ins)

{
  char *s;
  int iVar1;
  ast *a_00;
  attr *paVar2;
  array_t *paVar3;
  ast *paVar4;
  value *pvVar5;
  
  a_00 = child(node,1);
  iVar1 = a_00->type;
  while (iVar1 == -0x2708) {
    paVar2 = (attr *)malloc(0x10);
    paVar2->kind = 1;
    paVar3 = (array_t *)malloc(0x10);
    (paVar2->field_1).array = paVar3;
    paVar3->type = a;
    paVar4 = child(node,3);
    ((paVar2->field_1).basic)->type = *(int *)paVar4->val;
    paVar4 = child(a_00,1);
    node = a_00;
    a = paVar2;
    a_00 = paVar4;
    iVar1 = paVar4->type;
  }
  paVar2 = a;
  if ((((a->kind == 2) && (((a->field_1).structure)->field == (field_t *)0x0)) &&
      (s = ((a->field_1).structure)->name, s != (char *)0x0)) &&
     (paVar2 = findvar(s), paVar2 == (attr *)0x0)) {
    semerror(0x11,node->pos->first_line,semErrorMsg[0x11],((a->field_1).basic)->name);
    paVar2 = a;
  }
  if ((ins != 0) && (iVar1 = insertvar(a_00->val->typeval,paVar2), iVar1 == 0)) {
    semerror(3,a_00->pos->first_line,semErrorMsg[3],a_00->val->numval);
  }
  pvVar5 = (value *)malloc(0x20);
  *(undefined4 *)(pvVar5 + 2) = 0;
  pvVar5[1].typeval = (char *)paVar2;
  *pvVar5 = *a_00->val;
  pvVar5[3].numval = 0;
  return (field_t *)pvVar5;
}

Assistant:

static struct field_t* SEM_VarDec(struct ast *node, struct attr *a, int ins) {
    struct ast *child1 = child(node, 1);
    struct attr *sa = a;
    if (child1->type == VarDec) {
        struct attr *a1 = malloc(sizeof(struct attr));
        a1->kind = ARRAY;
        a1->array = malloc(sizeof(struct array_t));
        a1->array->type = a;
        a1->array->size = (int)child(node, 3)->val->numval;
        return SEM_VarDec(child1, a1, ins);
    }
    //DONETODO: error insert
    if (a->kind == STRUCTURE && a->structure->field == NULL && a->structure->name &&
        ((sa = findvar(a->structure->name)) == NULL)) {
//            printf("no such struct\n");
        SEMERROR(UndefinedStruct, node, a->structure->name);
        sa = a;
    }
    if (ins) {
        if (insertvar(child1->val->idval, sa) == 0)
            SEMERROR(RedefinedVariable, child1, child1->val->idval);
    }
    struct field_t *f = malloc(sizeof(struct field_t));
    f->isInit = 0;
    f->type = sa;
    f->name = child1->val->idval;
    f->next = NULL;
    return f;
}